

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O0

bool __thiscall
ON_CompressedBuffer::Compress
          (ON_CompressedBuffer *this,size_t sizeof__inbuffer,void *inbuffer,int sizeof_element)

{
  bool bVar1;
  endian eVar2;
  ON__UINT32 OVar3;
  size_t sVar4;
  void *pvVar5;
  bool bVar6;
  size_t sizeof_compressed;
  undefined1 local_4098 [7];
  bool bToggleByteOrder;
  ON_CompressedBufferHelper helper;
  bool rc;
  int sizeof_element_local;
  void *inbuffer_local;
  size_t sizeof__inbuffer_local;
  ON_CompressedBuffer *this_local;
  
  helper.m_buffer_compressed_capacity._4_4_ = sizeof_element;
  Destroy(this);
  helper.m_buffer_compressed_capacity._3_1_ = 0;
  if ((sizeof__inbuffer == 0) || (inbuffer != (void *)0x0)) {
    if (sizeof__inbuffer == 0) {
      this_local._7_1_ = true;
    }
    else if (sizeof__inbuffer < 0x100000000) {
      this->m_sizeof_uncompressed = sizeof__inbuffer;
      memset(local_4098,0,0x4068);
      local_4098._0_4_ = 1;
      bVar6 = false;
      if ((((helper.m_buffer_compressed_capacity._4_4_ == 2) ||
           (helper.m_buffer_compressed_capacity._4_4_ == 4)) ||
          (helper.m_buffer_compressed_capacity._4_4_ == 8)) &&
         (sizeof__inbuffer % (ulong)(long)helper.m_buffer_compressed_capacity._4_4_ == 0)) {
        this->m_sizeof_element = helper.m_buffer_compressed_capacity._4_4_;
        eVar2 = ON::Endian();
        bVar6 = eVar2 == big_endian;
      }
      if (bVar6) {
        ON_BinaryArchive::ToggleByteOrder
                  ((long)(int)(sizeof__inbuffer / (ulong)(long)this->m_sizeof_element),
                   (long)this->m_sizeof_element,inbuffer,inbuffer);
      }
      this->m_method = (uint)(0x80 < sizeof__inbuffer);
      if (this->m_method != 0) {
        bVar1 = CompressionInit(this,(ON_CompressedBufferHelper *)local_4098);
        if (bVar1) {
          pvVar5 = onmalloc(sizeof__inbuffer >> 2);
          this->m_buffer_compressed = pvVar5;
          sVar4 = DeflateHelper(this,(ON_CompressedBufferHelper *)local_4098,sizeof__inbuffer,
                                inbuffer);
          CompressionEnd(this,(ON_CompressedBufferHelper *)local_4098);
          if ((sVar4 == 0) || (sVar4 != this->m_sizeof_compressed)) {
            Destroy(this);
            this->m_method = 0;
          }
          else {
            helper.m_buffer_compressed_capacity._3_1_ = 1;
            if (this->m_sizeof_compressed * 3 < this->m_buffer_compressed_capacity * 2) {
              this->m_buffer_compressed_capacity = this->m_sizeof_compressed;
              pvVar5 = onrealloc(this->m_buffer_compressed,this->m_buffer_compressed_capacity);
              this->m_buffer_compressed = pvVar5;
            }
          }
        }
        else {
          CompressionEnd(this,(ON_CompressedBufferHelper *)local_4098);
          this->m_method = 0;
        }
      }
      if (this->m_method == 0) {
        pvVar5 = onmalloc(sizeof__inbuffer);
        this->m_buffer_compressed = pvVar5;
        if (this->m_buffer_compressed != (void *)0x0) {
          this->m_sizeof_compressed = sizeof__inbuffer;
          this->m_buffer_compressed_capacity = sizeof__inbuffer;
          memcpy(this->m_buffer_compressed,inbuffer,sizeof__inbuffer);
          helper.m_buffer_compressed_capacity._3_1_ = 1;
        }
      }
      if (bVar6) {
        ON_BinaryArchive::ToggleByteOrder
                  ((long)(int)(sizeof__inbuffer / (ulong)(long)this->m_sizeof_element),
                   (long)this->m_sizeof_element,inbuffer,inbuffer);
      }
      if ((helper.m_buffer_compressed_capacity._3_1_ & 1) != 0) {
        OVar3 = ON_CRC32(0,sizeof__inbuffer,inbuffer);
        this->m_crc_uncompressed = OVar3;
        OVar3 = ON_CRC32(0,this->m_sizeof_compressed,this->m_buffer_compressed);
        this->m_crc_compressed = OVar3;
      }
      this_local._7_1_ = (bool)(helper.m_buffer_compressed_capacity._3_1_ & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CompressedBuffer::Compress(
        size_t sizeof__inbuffer,  // sizeof uncompressed input data
        const void* inbuffer,     // uncompressed input data
        int sizeof_element
        )
{
  Destroy();

  //size_t compressed_size = 0;
  bool rc = false;

  if ( sizeof__inbuffer > 0 && 0 == inbuffer )
    return false;

  if ( 0 == sizeof__inbuffer )
    return true;

  if (sizeof__inbuffer > UINT32_MAX)
    return false;

  // number of bytes of uncompressed data
  m_sizeof_uncompressed = sizeof__inbuffer;

  ON_CompressedBufferHelper helper;
  memset(&helper,0,sizeof(helper));
  helper.m_action = 1;

  bool bToggleByteOrder = false;
  switch(sizeof_element)
  {
  case 2:
  case 4:
  case 8:
    if ( 0 == (sizeof__inbuffer%sizeof_element) )
    {
      m_sizeof_element = sizeof_element;
      bToggleByteOrder = (ON::endian::big_endian == ON::Endian());
    }
    break;
  };

  if ( bToggleByteOrder ) 
  {
    ON_BinaryFile::ToggleByteOrder( 
      (int)(sizeof__inbuffer/m_sizeof_element), 
      m_sizeof_element, 
      inbuffer, 
      (void*)inbuffer
      );
  }

  m_method = (sizeof__inbuffer > 128) ? 1 : 0;
  if ( m_method ) 
  {
    if ( !CompressionInit(&helper) ) 
    {
      CompressionEnd(&helper);
      m_method = 0;
    }
    else
    {
      m_buffer_compressed = onmalloc(sizeof__inbuffer/4);
      size_t sizeof_compressed = DeflateHelper( &helper, sizeof__inbuffer, inbuffer );
      CompressionEnd(&helper);
      if ( sizeof_compressed > 0 && sizeof_compressed == m_sizeof_compressed )
      {
        rc = true;
        if ( 2*m_buffer_compressed_capacity > 3*m_sizeof_compressed )
        {
          // release memory we don't need
          m_buffer_compressed_capacity = m_sizeof_compressed;
          m_buffer_compressed = onrealloc(m_buffer_compressed,m_buffer_compressed_capacity);
        }
      }
      else
      {
        Destroy();
        m_method = 0;
      }
    }
  }

  if ( 0 ==  m_method )
  {
    // uncompressed
    m_buffer_compressed = onmalloc(sizeof__inbuffer);
    if ( m_buffer_compressed )
    {
      m_sizeof_compressed = sizeof__inbuffer;
      m_buffer_compressed_capacity = sizeof__inbuffer;
      memcpy(m_buffer_compressed,inbuffer,sizeof__inbuffer);
      rc = true;
    }
  }

  if ( bToggleByteOrder ) 
  {
    ON_BinaryFile::ToggleByteOrder( 
      (int)(sizeof__inbuffer/m_sizeof_element), 
      m_sizeof_element, 
      inbuffer, 
      (void*)inbuffer
      );
  }

  if (rc)
  {
    m_crc_uncompressed = ON_CRC32( 0, sizeof__inbuffer, inbuffer );
    m_crc_compressed   = ON_CRC32( 0, m_sizeof_compressed, m_buffer_compressed );
  }

  return rc;
}